

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void gimage::anon_unknown_11::writePNMHeader
               (char *name,char *type,long width,long height,long maxval,float scale)

{
  ostream *poVar1;
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((char *)&out,(_Ios_Openmode)name);
  poVar1 = std::operator<<((ostream *)&out,type);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<long>((long)&out);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((*type == 'P') &&
     (((type[1] == 'f' && (type[2] == '\0')) || ((type[1] == 'F' && (type[2] == '\0')))))) {
    poVar1 = (ostream *)std::ostream::operator<<(&out,scale);
  }
  else {
    poVar1 = std::ostream::_M_insert<long>((long)&out);
  }
  std::operator<<(poVar1,"\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void writePNMHeader(const char *name, const char *type, long width,
                    long height, long maxval, float scale)
{
  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name, std::ios::binary);
    out << type << std::endl;
    out << width << " " << height << std::endl;

    if (strcmp(type, "Pf") == 0 || strcmp(type, "PF") == 0)
    {
      out << scale << "\n";
    }
    else
    {
      out << maxval << "\n";
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}